

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_encoder.cpp
# Opt level: O2

idx_t __thiscall
duckdb::CSVEncoder::Encode
          (CSVEncoder *this,FileHandle *file_handle_input,char *output_buffer,
          idx_t decoded_buffer_size)

{
  idx_t *piVar1;
  CSVEncoderBuffer *pCVar2;
  optional_ptr<duckdb::EncodingFunction,_true> *this_00;
  char *pcVar3;
  idx_t iVar4;
  ulong uVar5;
  EncodingFunction *pEVar6;
  ulong uVar7;
  reference pvVar8;
  int64_t iVar9;
  byte bVar10;
  bool bVar11;
  idx_t iVar12;
  idx_t i;
  idx_t current_decoded_buffer_start;
  idx_t output_buffer_pos;
  idx_t local_70;
  vector<char,_true> pass_on_buffer;
  
  output_buffer_pos = 0;
  uVar5 = (this->remaining_bytes_buffer).cur_pos;
  uVar7 = (this->remaining_bytes_buffer).actual_encoded_buffer_size;
  piVar1 = &(this->remaining_bytes_buffer).actual_encoded_buffer_size;
  if (uVar5 < uVar7) {
    pCVar2 = &this->remaining_bytes_buffer;
    pcVar3 = (this->remaining_bytes_buffer).encoded_buffer._M_t.
             super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl;
    iVar4 = 1;
    while (iVar12 = iVar4, uVar5 < uVar7) {
      output_buffer[iVar12 - 1] = pcVar3[uVar5];
      uVar5 = pCVar2->cur_pos + 1;
      pCVar2->cur_pos = uVar5;
      iVar4 = iVar12 + 1;
      output_buffer_pos = iVar12;
      uVar7 = *piVar1;
    }
    pCVar2->cur_pos = 0;
    (this->remaining_bytes_buffer).actual_encoded_buffer_size = 0;
  }
  pCVar2 = &this->encoded_buffer;
  local_70 = decoded_buffer_size;
  if ((this->encoded_buffer).cur_pos < (this->encoded_buffer).actual_encoded_buffer_size) {
    pEVar6 = optional_ptr<duckdb::EncodingFunction,_true>::operator->(&this->encoding_function);
    (*pEVar6->encode_function)
              (pCVar2,output_buffer,&output_buffer_pos,local_70,
               (this->remaining_bytes_buffer).encoded_buffer._M_t.
               super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl,piVar1,
               (this->encoding_function).ptr);
  }
  this_00 = &this->encoding_function;
  do {
    iVar4 = output_buffer_pos;
    if (local_70 <= output_buffer_pos) {
      return output_buffer_pos;
    }
    pass_on_buffer.super_vector<char,_std::allocator<char>_>.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pass_on_buffer.super_vector<char,_std::allocator<char>_>.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    pass_on_buffer.super_vector<char,_std::allocator<char>_>.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    if ((this->encoded_buffer).cur_pos != (this->encoded_buffer).actual_encoded_buffer_size) {
      pEVar6 = optional_ptr<duckdb::EncodingFunction,_true>::operator->(this_00);
      uVar5 = (this->encoded_buffer).actual_encoded_buffer_size - (this->encoded_buffer).cur_pos;
      if (uVar5 < pEVar6->lookup_bytes) {
        for (; pEVar6 = optional_ptr<duckdb::EncodingFunction,_true>::operator->(this_00),
            uVar5 < pEVar6->lookup_bytes; uVar5 = uVar5 + 1) {
          ::std::vector<char,_std::allocator<char>_>::push_back
                    ((vector<char,_std::allocator<char>_> *)&pass_on_buffer,
                     (this->encoded_buffer).encoded_buffer._M_t.
                     super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                     super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl + uVar5);
        }
      }
    }
    pCVar2->cur_pos = 0;
    (this->encoded_buffer).actual_encoded_buffer_size = 0;
    for (uVar5 = 0;
        uVar7 = (long)pass_on_buffer.super_vector<char,_std::allocator<char>_>.
                      super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)pass_on_buffer.super_vector<char,_std::allocator<char>_>.
                      super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start, uVar5 < uVar7; uVar5 = uVar5 + 1) {
      pvVar8 = vector<char,_true>::get<true>(&pass_on_buffer,uVar5);
      (this->encoded_buffer).encoded_buffer._M_t.
      super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl[uVar5] = *pvVar8;
    }
    bVar10 = this->has_pass_on_byte;
    if ((bool)bVar10 != false) {
      (this->encoded_buffer).encoded_buffer._M_t.
      super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl[uVar7] = this->pass_on_byte;
      bVar10 = this->has_pass_on_byte;
      uVar7 = (long)pass_on_buffer.super_vector<char,_std::allocator<char>_>.
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                    _M_finish -
              (long)pass_on_buffer.super_vector<char,_std::allocator<char>_>.
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                    _M_start;
    }
    uVar5 = FileHandle::Read(file_handle_input,
                             (this->encoded_buffer).encoded_buffer._M_t.
                             super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                             super__Head_base<0UL,_char_*,_false>._M_head_impl + bVar10 + uVar7,
                             (this->encoded_buffer).encoded_buffer_size - (bVar10 + uVar7));
    (this->encoded_buffer).actual_encoded_buffer_size =
         (ulong)this->has_pass_on_byte +
         ((long)pass_on_buffer.super_vector<char,_std::allocator<char>_>.
                super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_finish -
         (long)pass_on_buffer.super_vector<char,_std::allocator<char>_>.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start) + uVar5;
    if (uVar5 < (this->encoded_buffer).encoded_buffer_size -
                ((long)pass_on_buffer.super_vector<char,_std::allocator<char>_>.
                       super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)pass_on_buffer.super_vector<char,_std::allocator<char>_>.
                      super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start)) {
LAB_018932c7:
      (this->encoded_buffer).last_buffer = true;
      bVar11 = false;
    }
    else {
      iVar9 = FileHandle::Read(file_handle_input,&this->pass_on_byte,1);
      bVar11 = true;
      if (iVar9 == 0) goto LAB_018932c7;
    }
    this->has_pass_on_byte = bVar11;
    pEVar6 = optional_ptr<duckdb::EncodingFunction,_true>::operator->(this_00);
    (*pEVar6->encode_function)
              (pCVar2,output_buffer,&output_buffer_pos,local_70,
               (this->remaining_bytes_buffer).encoded_buffer._M_t.
               super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl,piVar1,
               (this->encoding_function).ptr);
    iVar12 = output_buffer_pos;
    ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&pass_on_buffer);
    if (iVar12 == iVar4) {
      return iVar4;
    }
  } while( true );
}

Assistant:

idx_t CSVEncoder::Encode(FileHandle &file_handle_input, char *output_buffer, const idx_t decoded_buffer_size) {
	idx_t output_buffer_pos = 0;
	// Check if we have some left-overs. These can either be
	// 1. missing decoded bytes
	if (remaining_bytes_buffer.HasDataToRead()) {
		D_ASSERT(remaining_bytes_buffer.cur_pos == 0);
		const auto remaining_bytes_buffer_ptr = remaining_bytes_buffer.Ptr();
		for (; remaining_bytes_buffer.cur_pos < remaining_bytes_buffer.GetSize(); remaining_bytes_buffer.cur_pos++) {
			output_buffer[output_buffer_pos++] = remaining_bytes_buffer_ptr[remaining_bytes_buffer.cur_pos];
		}
		remaining_bytes_buffer.Reset();
	}
	// 2. remaining encoded buffer
	if (encoded_buffer.HasDataToRead()) {
		encoding_function->GetFunction()(encoded_buffer, output_buffer, output_buffer_pos, decoded_buffer_size,
		                                 remaining_bytes_buffer.Ptr(),
		                                 remaining_bytes_buffer.actual_encoded_buffer_size, encoding_function.get());
	}
	// 3. a new encoded buffer from the file
	while (output_buffer_pos < decoded_buffer_size) {
		idx_t current_decoded_buffer_start = output_buffer_pos;
		vector<char> pass_on_buffer;
		if (encoded_buffer.cur_pos != encoded_buffer.GetSize() &&
		    encoding_function->GetLookupBytes() > encoded_buffer.GetSize() - encoded_buffer.cur_pos) {
			// We don't have enough lookup bytes for it, if that's the case, we need to set off these bytes to the next
			// buffer
			for (idx_t i = encoded_buffer.GetSize() - encoded_buffer.cur_pos; i < encoding_function->GetLookupBytes();
			     i++) {
				pass_on_buffer.push_back(encoded_buffer.Ptr()[i]);
			}
		}
		encoded_buffer.Reset();
		for (idx_t i = 0; i < pass_on_buffer.size(); i++) {
			encoded_buffer.Ptr()[i] = pass_on_buffer[i];
		}
		if (has_pass_on_byte) {
			encoded_buffer.Ptr()[pass_on_buffer.size()] = pass_on_byte;
		}
		auto actual_encoded_bytes = static_cast<idx_t>(
		    file_handle_input.Read(encoded_buffer.Ptr() + pass_on_buffer.size() + has_pass_on_byte,
		                           encoded_buffer.GetCapacity() - pass_on_buffer.size() - has_pass_on_byte));
		encoded_buffer.SetSize(actual_encoded_bytes + pass_on_buffer.size() + has_pass_on_byte);
		if (actual_encoded_bytes < encoded_buffer.GetCapacity() - pass_on_buffer.size()) {
			encoded_buffer.last_buffer = true;
			has_pass_on_byte = false;
		} else {
			auto bytes_read = static_cast<idx_t>(file_handle_input.Read(&pass_on_byte, 1));
			if (bytes_read == 0) {
				encoded_buffer.last_buffer = true;
				has_pass_on_byte = false;
			} else {
				has_pass_on_byte = true;
			}
		}
		encoding_function->GetFunction()(encoded_buffer, output_buffer, output_buffer_pos, decoded_buffer_size,
		                                 remaining_bytes_buffer.Ptr(),
		                                 remaining_bytes_buffer.actual_encoded_buffer_size, encoding_function.get());
		if (output_buffer_pos == current_decoded_buffer_start) {
			return output_buffer_pos;
		}
	}
	return output_buffer_pos;
}